

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui-ext.cpp
# Opt level: O1

void ImDrawList_AddImageRounded
               (ImDrawList *self,ImTextureID user_texture_id,ImVec2 a,ImVec2 b,ImVec2 uv_a,
               ImVec2 uv_b,ImU32 col,float rounding,int rounding_corners)

{
  ImVec2 uv_b_local;
  ImVec2 uv_a_local;
  ImVec2 b_local;
  ImVec2 a_local;
  
  uv_b_local = uv_b;
  uv_a_local = uv_a;
  b_local = b;
  a_local = a;
  ImDrawList::AddImageRounded
            (self,user_texture_id,&a_local,&b_local,&uv_a_local,&uv_b_local,col,rounding,
             rounding_corners);
  return;
}

Assistant:

CIMGUI_API void _ImDrawList_AddImageRounded (ImDrawList *larg1, ImTextureID *larg2, ImVec2 const *larg3, ImVec2 const *larg4, ImVec2 const *larg5, ImVec2 const *larg6, ImU32 *larg7, float larg8, int larg9) {
  ImDrawList *arg1 = (ImDrawList *) 0 ;
  ImTextureID arg2 ;
  ImVec2 arg3 ;
  ImVec2 arg4 ;
  ImVec2 arg5 ;
  ImVec2 arg6 ;
  ImU32 arg7 ;
  float arg8 ;
  int arg9 ;
  
  arg1 = larg1;
  arg2 = *larg2;
  arg3 = *larg3;
  arg4 = *larg4;
  arg5 = *larg5;
  arg6 = *larg6;
  arg7 = *larg7;
  arg8 = larg8;
  arg9 = larg9;
  try {
    ImDrawList_AddImageRounded(arg1,arg2,arg3,arg4,arg5,arg6,arg7,arg8,arg9);
    
  } catch (...) {
    
  }
}